

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int in_ECX;
  int r;
  long lVar2;
  undefined4 in_register_00000014;
  long lVar3;
  Matrix<float,_2,_3> *pMVar4;
  Matrix<float,_2,_3> retVal;
  Type in0;
  Matrix<float,_2,_3> local_68;
  Mat3x2 local_50;
  Vector<float,_3> local_38;
  VecAccess<float,_4,_3> local_28;
  
  pMVar4 = &local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
              (&local_50,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_2,_3>::Matrix(&local_50,(float *)sr::(anonymous_namespace)::s_constInMat3x2);
  }
  tcu::Matrix<float,_2,_3>::Matrix(&local_68);
  pfVar1 = (float *)&local_50;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      *(uint *)((long)pMVar4 + lVar3 * 8) = (uint)pfVar1[lVar3 * 2] ^ 0x80000000;
    }
    pMVar4 = (Matrix<float,_2,_3> *)((long)pMVar4 + 4);
    pfVar1 = pfVar1 + 1;
  }
  local_38.m_data[2] = local_68.m_data.m_data[2].m_data[0] + local_68.m_data.m_data[2].m_data[1];
  local_38.m_data[1] = local_68.m_data.m_data[1].m_data[1] + local_68.m_data.m_data[1].m_data[0];
  local_38.m_data[0] = local_68.m_data.m_data[0].m_data[0] + local_68.m_data.m_data[0].m_data[1];
  local_28.m_vector = &evalCtx->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,&local_38);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}